

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_fault.cc
# Opt level: O2

void __thiscall fault_parse_icc_cov_file_Test::TestBody(fault_parse_icc_cov_file_Test *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  int iVar2;
  Generator *pGVar3;
  Port *var;
  undefined4 extraout_var;
  Generator *top;
  char *message;
  char *in_R9;
  uint uVar4;
  undefined8 *puVar5;
  bool bVar6;
  undefined1 local_230 [8];
  Context c;
  __shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2> local_e0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d8;
  AssertHelper local_d0;
  Generator *local_c8;
  undefined1 local_c0 [8];
  shared_ptr<kratos::CombinationalStmtBlock> comb;
  shared_ptr<kratos::IfStmt> if_;
  unordered_map<kratos::Stmt_*,_unsigned_int,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<std::pair<kratos::Stmt_*const,_unsigned_int>_>_>
  result;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  AssertHelper local_38;
  
  kratos::Context::Context((Context *)local_230);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)
             &if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount,"mod",
             (allocator<char> *)&gtest_ar_.message_);
  pGVar3 = kratos::Context::generator
                     ((Context *)local_230,
                      (string *)
                      &if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount);
  std::__cxx11::string::~string
            ((string *)
             &if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  pGVar3->debug = true;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)
             &if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount,"in",
             (allocator<char> *)&gtest_ar_.message_);
  kratos::Generator::port
            (pGVar3,In,
             (string *)
             &if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount,4);
  std::__cxx11::string::~string
            ((string *)
             &if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)
             &if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount,"sel",
             (allocator<char> *)&gtest_ar_.message_);
  kratos::Generator::port
            (pGVar3,In,
             (string *)
             &if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount,4);
  std::__cxx11::string::~string
            ((string *)
             &if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)
             &if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount,"out",
             (allocator<char> *)&gtest_ar_.message_);
  var = kratos::Generator::port
                  (pGVar3,Out,
                   (string *)
                   &if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount,4
                  );
  std::__cxx11::string::~string
            ((string *)
             &if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)
             &if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             "KRATOS_INSTANCE_ID",(allocator<char> *)&gtest_ar_.message_);
  kratos::Generator::parameter
            (pGVar3,(string *)
                    &if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             0x20);
  std::__cxx11::string::~string
            ((string *)
             &if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::make_shared<kratos::CombinationalStmtBlock>();
  std::__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<kratos::CombinationalStmtBlock,void>
            (local_e0,(__shared_ptr<kratos::CombinationalStmtBlock,_(__gnu_cxx::_Lock_policy)2> *)
                      local_c0);
  kratos::Generator::add_stmt(pGVar3,(shared_ptr<kratos::Stmt> *)local_e0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d8);
  std::make_shared<kratos::IfStmt,kratos::Port&>
            ((Port *)&comb.
                      super___shared_ptr<kratos::CombinationalStmtBlock,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
  this_00 = &if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::IfStmt,void>
            ((__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2> *)this_00,
             (__shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2> *)
             &comb.super___shared_ptr<kratos::CombinationalStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  kratos::StmtBlock::add_stmt((StmtBlock *)local_c0,(shared_ptr<kratos::Stmt> *)this_00);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&result);
  _Var1 = comb.super___shared_ptr<kratos::CombinationalStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount;
  kratos::Const::constant(0,4,false);
  kratos::Var::assign((Var *)&gtest_ar_.message_,&var->super_Var);
  if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       gtest_ar_.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  result._M_h._M_buckets = (__buckets_ptr)gtest_ar._0_8_;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  local_c8 = pGVar3;
  kratos::IfStmt::add_then_stmt
            ((IfStmt *)_Var1._M_pi,
             (shared_ptr<kratos::Stmt> *)
             &if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&result);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&gtest_ar);
  for (uVar4 = 0;
      _Var1._M_pi = comb.
                    super___shared_ptr<kratos::CombinationalStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi, pGVar3 = local_c8, uVar4 != 4; uVar4 = uVar4 + 1) {
    iVar2 = (*(var->super_Var).super_IRNode._vptr_IRNode[9])(var,(ulong)uVar4);
    kratos::Const::constant(1,1,false);
    kratos::Var::assign((Var *)&gtest_ar_.message_,(Var *)CONCAT44(extraout_var,iVar2));
    if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         gtest_ar_.message_._M_t.
         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
    result._M_h._M_buckets = (__buckets_ptr)gtest_ar._0_8_;
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar.success_ = false;
    gtest_ar._1_7_ = 0;
    kratos::IfStmt::add_else_stmt
              ((IfStmt *)_Var1._M_pi,
               (shared_ptr<kratos::Stmt> *)
               &if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&result);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&gtest_ar);
  }
  kratos::fix_assignment_type(local_c8);
  kratos::generate_verilog_abi_cxx11_
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&c.tracked_generators_._M_h._M_single_bucket,(kratos *)pGVar3,top);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&c.tracked_generators_._M_h._M_single_bucket);
  std::__cxx11::string::assign((char *)&pGVar3->verilog_fn);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar_.message_,"icc_cov.txt",
             (allocator<char> *)&result._M_h._M_single_bucket);
  kratos::parse_icc_coverage
            ((unordered_map<kratos::Stmt_*,_unsigned_int,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<std::pair<kratos::Stmt_*const,_unsigned_int>_>_>
              *)&if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             pGVar3,(string *)&gtest_ar_.message_);
  std::__cxx11::string::~string((string *)&gtest_ar_.message_);
  result._M_h._M_single_bucket = result._M_h._M_before_begin._M_nxt;
  local_38.data_._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&gtest_ar_.message_,"result.size()","2",
             (unsigned_long *)&result._M_h._M_single_bucket,(int *)&local_38);
  if ((char)gtest_ar_.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl == '\0') {
    testing::Message::Message((Message *)&result._M_h._M_single_bucket);
    if (gtest_ar._0_8_ == 0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_fault.cc"
               ,0xa9,message);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&result._M_h._M_single_bucket);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (result._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (*(code *)(result._M_h._M_single_bucket)->_M_nxt[1]._M_nxt)();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar);
  for (puVar5 = (undefined8 *)result._M_h._M_bucket_count; puVar5 != (undefined8 *)0x0;
      puVar5 = (undefined8 *)*puVar5) {
    gtest_ar_.success_ = false;
    gtest_ar_._1_7_ = 0;
    bVar6 = *(int *)(puVar5[1] + 0x78) == 4;
    result._M_h._M_single_bucket =
         (__node_base_ptr)CONCAT71(result._M_h._M_single_bucket._1_7_,bVar6);
    if (!bVar6) {
      testing::Message::Message((Message *)&local_38);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar_.message_,(internal *)&result._M_h._M_single_bucket,
                 (AssertionResult *)"iter.first->type() == StatementType::Block","false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_fault.cc"
                 ,0xab,(char *)gtest_ar_.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl);
      testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_38);
      testing::internal::AssertHelper::~AssertHelper(&local_d0);
      std::__cxx11::string::~string((string *)&gtest_ar_.message_);
      if ((long *)CONCAT44(local_38.data_._4_4_,local_38.data_._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_38.data_._4_4_,local_38.data_._0_4_) + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&gtest_ar_);
  }
  std::
  _Hashtable<kratos::Stmt_*,_std::pair<kratos::Stmt_*const,_unsigned_int>,_std::allocator<std::pair<kratos::Stmt_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Stmt_*>,_std::hash<kratos::Stmt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<kratos::Stmt_*,_std::pair<kratos::Stmt_*const,_unsigned_int>,_std::allocator<std::pair<kratos::Stmt_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Stmt_*>,_std::hash<kratos::Stmt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&if_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&comb);
  kratos::Context::~Context((Context *)local_230);
  return;
}

Assistant:

TEST(fault, parse_icc_cov_file) {  // NOLINT
    Context c;
    auto &mod = c.generator("mod");
    mod.debug = true;
    mod.port(PortDirection::In, "in", 4);
    auto &sel = mod.port(PortDirection::In, "sel", 4);
    auto &out = mod.port(PortDirection::Out, "out", 4);
    mod.parameter("KRATOS_INSTANCE_ID", 32);

    auto comb = std::make_shared<CombinationalStmtBlock>();
    mod.add_stmt(comb);
    auto if_ = std::make_shared<IfStmt>(sel);
    comb->add_stmt(if_);
    if_->add_then_stmt(out.assign(constant(0, 4)));
    for (uint32_t i = 0; i < 4; i++) {
        if_->add_else_stmt(out[i].assign(constant(1, 1)));
    }

    fix_assignment_type(&mod);
    generate_verilog(&mod);
    // fake the output
    mod.verilog_fn = "test.sv";

    auto result = parse_icc_coverage(&mod, "icc_cov.txt");
    EXPECT_EQ(result.size(), 2);
    for (auto const &iter : result) {
        EXPECT_TRUE(iter.first->type() == StatementType::Block);
    }
}